

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chorus.cpp
# Opt level: O3

EffectProps * __thiscall
anon_unknown.dwarf_1368b5::ChorusStateFactory::getDefaultProps
          (EffectProps *__return_storage_ptr__,ChorusStateFactory *this)

{
  *(float *)((long)__return_storage_ptr__ + 0x58) = 0.0;
  *(float *)((long)__return_storage_ptr__ + 0x5c) = 0.0;
  *(float *)((long)__return_storage_ptr__ + 0x60) = 0.0;
  *(float *)((long)__return_storage_ptr__ + 100) = 0.0;
  ((float *)((long)__return_storage_ptr__ + 0x48))[0] = 0.0;
  ((float *)((long)__return_storage_ptr__ + 0x48))[1] = 0.0;
  *(undefined8 *)((__return_storage_ptr__->Reverb).LateReverbPan + 2) = 0;
  *(float *)((long)__return_storage_ptr__ + 0x38) = 0.0;
  ((float *)((long)__return_storage_ptr__ + 0x3c))[0] = 0.0;
  ((float *)((long)__return_storage_ptr__ + 0x3c))[1] = 0.0;
  ((float *)((long)__return_storage_ptr__ + 0x3c))[2] = 0.0;
  *(float *)((long)__return_storage_ptr__ + 0x28) = 0.0;
  *(float *)((long)__return_storage_ptr__ + 0x2c) = 0.0;
  *(bool *)((long)__return_storage_ptr__ + 0x30) = false;
  *(undefined3 *)((long)__return_storage_ptr__ + 0x31) = 0;
  *(float *)((long)__return_storage_ptr__ + 0x34) = 0.0;
  *(float *)((long)__return_storage_ptr__ + 0x18) = 0.0;
  *(float *)((long)__return_storage_ptr__ + 0x1c) = 0.0;
  *(float *)((long)__return_storage_ptr__ + 0x20) = 0.0;
  *(float *)((long)__return_storage_ptr__ + 0x24) = 0.0;
  (__return_storage_ptr__->Reverb).LFReference = 0.0;
  *(int *)__return_storage_ptr__ = 1;
  *(int *)((long)__return_storage_ptr__ + 4) = 0x5a;
  *(float *)((long)__return_storage_ptr__ + 8) = 1.1;
  *(float *)((long)__return_storage_ptr__ + 0xc) = 0.1;
  *(float *)((long)__return_storage_ptr__ + 0x10) = 0.25;
  *(float *)((long)__return_storage_ptr__ + 0x14) = 0.016;
  return __return_storage_ptr__;
}

Assistant:

EffectProps ChorusStateFactory::getDefaultProps() const noexcept
{
    EffectProps props{};
    props.Chorus.Waveform = AL_CHORUS_DEFAULT_WAVEFORM;
    props.Chorus.Phase = AL_CHORUS_DEFAULT_PHASE;
    props.Chorus.Rate = AL_CHORUS_DEFAULT_RATE;
    props.Chorus.Depth = AL_CHORUS_DEFAULT_DEPTH;
    props.Chorus.Feedback = AL_CHORUS_DEFAULT_FEEDBACK;
    props.Chorus.Delay = AL_CHORUS_DEFAULT_DELAY;
    return props;
}